

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_serializer.hpp
# Opt level: O3

void __thiscall duckdb::BinarySerializer::VarIntEncode<int>(BinarySerializer *this,int value)

{
  long lVar1;
  uint uVar2;
  uint8_t buffer [16];
  byte local_18 [24];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  local_18[5] = 0;
  local_18[6] = 0;
  local_18[7] = 0;
  local_18[8] = 0;
  local_18[9] = 0;
  local_18[10] = 0;
  local_18[0xb] = 0;
  local_18[0xc] = 0;
  local_18[0xd] = 0;
  local_18[0xe] = 0;
  local_18[0xf] = 0;
  lVar1 = 0;
  if (0x3f < (uint)value) {
    do {
      uVar2 = value >> 7;
      if ((uVar2 == 0xffffffff & (byte)((value & 0x40U) >> 6)) != 0) break;
      local_18[lVar1] = (byte)value | 0x80;
      lVar1 = lVar1 + 1;
      value = uVar2;
    } while (0x3f < uVar2);
  }
  local_18[lVar1] = (byte)value & 0x7f;
  (**this->stream->_vptr_WriteStream)(this->stream,local_18,lVar1 + 1);
  return;
}

Assistant:

void VarIntEncode(T value) {
		uint8_t buffer[16] = {};
		auto write_size = EncodingUtil::EncodeLEB128<T>(buffer, value);
		D_ASSERT(write_size <= sizeof(buffer));
		WriteData(buffer, write_size);
	}